

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

MatchType __thiscall TileData::tryMatching(TileData *this,TileData *other)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  const_iterator pvVar5;
  const_iterator pvVar6;
  const_iterator pvVar7;
  size_type sVar8;
  byte *pbVar9;
  byte local_24;
  uint8_t rhs;
  uint8_t lhs;
  uint8_t i;
  bool hasVHFlip;
  bool hasVFlip;
  TileData *other_local;
  TileData *this_local;
  
  bVar4 = std::operator==(&this->_data,&other->_data);
  if (bVar4) {
    this_local._4_4_ = EXACT;
  }
  else if ((options.allowMirroring & 1U) == 0) {
    this_local._4_4_ = NOPE;
  }
  else {
    pvVar5 = std::array<unsigned_char,_16UL>::begin(&this->_data);
    pvVar6 = std::array<unsigned_char,_16UL>::end(&this->_data);
    pvVar7 = std::array<unsigned_char,_16UL>::begin(&other->_data);
    bVar4 = std::
            equal<unsigned_char_const*,unsigned_char_const*,TileData::tryMatching(TileData_const&)const::_lambda(unsigned_char,unsigned_char)_1_>
                      (pvVar5,pvVar6,pvVar7);
    if (bVar4) {
      this_local._4_4_ = HFLIP;
    }
    else {
      bVar4 = true;
      bVar2 = true;
      for (local_24 = 0; sVar8 = std::array<unsigned_char,_16UL>::size(&this->_data),
          local_24 < sVar8; local_24 = local_24 + 1) {
        pbVar9 = std::array<unsigned_char,_16UL>::operator[](&this->_data,(ulong)local_24);
        bVar1 = *pbVar9;
        pbVar9 = std::array<unsigned_char,_16UL>::operator[]
                           (&other->_data,(long)(int)(0xf - local_24 ^ 1));
        if (bVar1 != *pbVar9) {
          bVar4 = false;
        }
        pbVar9 = std::array<unsigned_char,_256UL>::operator[](&flipTable,(ulong)*pbVar9);
        if (bVar1 != *pbVar9) {
          bVar2 = false;
        }
        if ((!bVar4) && (!bVar2)) {
          return NOPE;
        }
      }
      bVar3 = true;
      if (!bVar4) {
        bVar3 = bVar2;
      }
      if (!bVar3) {
        __assert_fail("hasVFlip || hasVHFlip",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                      ,0x2f6,"tryMatching");
      }
      this_local._4_4_ = VHFLIP;
      if (bVar4) {
        this_local._4_4_ = VFLIP;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

MatchType tryMatching(TileData const &other) const {
		// Check for strict equality first, as that can typically be optimized, and it allows
		// hoisting the mirroring check out of the loop
		if (_data == other._data) {
			return MatchType::EXACT;
		}

		if (!options.allowMirroring) {
			return MatchType::NOPE;
		}

		// Check if we have horizontal mirroring, which scans the array forward again
		if (std::equal(_data.begin(), _data.end(), other._data.begin(),
		               [](uint8_t lhs, uint8_t rhs) { return lhs == flipTable[rhs]; })) {
			return MatchType::HFLIP;
		}

		// Check if we have vertical or vertical+horizontal mirroring, for which we have to read
		// bitplane *pairs*  backwards
		bool hasVFlip = true, hasVHFlip = true;
		for (uint8_t i = 0; i < _data.size(); ++i) {
			// Flip the bottom bit to get the corresponding row's bitplane 0/1
			// (This works because the array size is even)
			uint8_t lhs = _data[i], rhs = other._data[(15 - i) ^ 1];
			if (lhs != rhs) {
				hasVFlip = false;
			}
			if (lhs != flipTable[rhs]) {
				hasVHFlip = false;
			}
			if (!hasVFlip && !hasVHFlip) {
				return MatchType::NOPE; // If both have been eliminated, all hope is lost!
			}
		}

		// If we have both (i.e. we have symmetry), default to vflip only
		assert(hasVFlip || hasVHFlip);
		return hasVFlip ? MatchType::VFLIP : MatchType::VHFLIP;
	}